

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O3

void __thiscall t_d_generator::generate_enum(t_d_generator *this,t_enum *tenum)

{
  ofstream_with_content_based_conditional_update *out;
  int *piVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  pointer pptVar4;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string enum_name;
  string local_88;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_68;
  string local_50;
  
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector(&local_68,&tenum->constants_)
  ;
  out = &this->f_types_;
  emit_doc(this,(t_doc *)tenum,(ostream *)out);
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  suffix_if_reserved(&local_50,(string *)CONCAT44(extraout_var,iVar2));
  t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"enum ",5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar4 = local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      emit_doc(this,&(*pptVar4)->super_t_doc,(ostream *)out);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)out);
      suffix_if_reserved(&local_88,&(*pptVar4)->name_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_88._M_dataplus._M_p,local_88._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out," = ",3);
      poVar3 = (ostream *)std::ostream::operator<<(out,(*pptVar4)->value_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generate_enum(t_enum* tenum) override {
    vector<t_enum_value*> constants = tenum->get_constants();

    this->emit_doc(tenum, f_types_);
    string enum_name = suffix_if_reserved(tenum->get_name());
    f_types_ << indent() << "enum " << enum_name << " {" << endl;

    indent_up();

    vector<t_enum_value*>::const_iterator c_iter;
    for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
      this->emit_doc(*c_iter, f_types_);
      indent(f_types_) << suffix_if_reserved((*c_iter)->get_name());
      f_types_ << " = " << (*c_iter)->get_value() << ",";
    }

    f_types_ << endl;
    indent_down();
    indent(f_types_) << "}" << endl;

    f_types_ << endl;
  }